

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DC4_C(uint8_t *dst)

{
  long in_RDI;
  int i;
  uint32_t dc;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 4;
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    local_c = (uint)*(byte *)(in_RDI + (local_10 + -0x20)) +
              (uint)*(byte *)(in_RDI + (local_10 * 0x20 + -1)) + local_c;
  }
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    memset((void *)(in_RDI + (local_10 << 5)),local_c >> 3 & 0xff,4);
  }
  return;
}

Assistant:

static void DC4_C(uint8_t* dst) {   // DC
  uint32_t dc = 4;
  int i;
  for (i = 0; i < 4; ++i) dc += dst[i - BPS] + dst[-1 + i * BPS];
  dc >>= 3;
  for (i = 0; i < 4; ++i) memset(dst + i * BPS, dc, 4);
}